

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_jsonmodelserialiser.cpp
# Opt level: O0

void JsonModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte bVar1;
  JsonFormat JVar2;
  JsonFormat _r_2;
  bool _r_1;
  QJsonObject _r;
  JsonModelSerialiser *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    __r = _o;
    switch(_id) {
    case 0:
      setFormat((JsonModelSerialiser *)_o,*_a[1]);
      break;
    case 1:
      (**(code **)(*(long *)_o + 0xd0))(&_r_2);
      if (*_a != (void *)0x0) {
        QJsonObject::operator=((QJsonObject *)*_a,(QJsonObject *)&_r_2);
      }
      QJsonObject::~QJsonObject((QJsonObject *)&_r_2);
      break;
    case 2:
      bVar1 = (**(code **)(*(long *)_o + 0xd8))(_o,_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar1 & 1;
      }
      break;
    case 3:
      JVar2 = format((JsonModelSerialiser *)_o);
      if (*_a != (void *)0x0) {
        *(JsonFormat *)*_a = JVar2;
      }
    }
  }
  return;
}

Assistant:

void JsonModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<JsonModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->setFormat((*reinterpret_cast< std::add_pointer_t<QJsonDocument::JsonFormat>>(_a[1]))); break;
        case 1: { QJsonObject _r = _t->toJsonObject();
            if (_a[0]) *reinterpret_cast< QJsonObject*>(_a[0]) = std::move(_r); }  break;
        case 2: { bool _r = _t->fromJsonObject((*reinterpret_cast< std::add_pointer_t<QJsonObject>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: { QJsonDocument::JsonFormat _r = _t->format();
            if (_a[0]) *reinterpret_cast< QJsonDocument::JsonFormat*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
}